

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

float linalg::uangle<float,4>(vec<float,_4> *a,vec<float,_4> *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float __x;
  float fVar9;
  
  uVar1 = a->x;
  uVar5 = a->y;
  uVar2 = a->z;
  uVar6 = a->w;
  uVar3 = b->x;
  uVar7 = b->y;
  uVar4 = b->z;
  uVar8 = b->w;
  fVar9 = (float)uVar8 * (float)uVar6 +
          (float)uVar7 * (float)uVar5 + (float)uVar3 * (float)uVar1 + 0.0 +
          (float)uVar4 * (float)uVar2;
  if (1.0 < fVar9) {
    return 0.0;
  }
  __x = -1.0;
  if (-1.0 <= fVar9) {
    __x = fVar9;
  }
  fVar9 = acosf(__x);
  return fVar9;
}

Assistant:

constexpr auto operator() (A & a) const -> decltype(a.y) { return a.y; }